

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtIsOnArc.cpp
# Opt level: O3

bool GeoCalcs::PtIsOnArc(LLPoint *llArcCenter,double dArcRadius,double dArcStartAzimuth,
                        double dArcEndAzimuth,int nArcDirection,LLPoint *llTestPt,int *bOnArc)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  InverseResult invResult;
  InverseResult local_38;
  
  local_38.azimuth = 0.0;
  local_38.reverseAzimuth = 0.0;
  local_38.distance = 0.0;
  bVar1 = DistVincenty(llArcCenter,llTestPt,&local_38);
  if (!bVar1) {
    return bVar1;
  }
  *bOnArc = 0;
  if (ABS(local_38.distance - dArcRadius) <= 0.0005) {
    dVar2 = GetArcExtent(dArcStartAzimuth,dArcEndAzimuth,nArcDirection,1e-09);
    if ((dVar2 != 6.283185307179586) || (NAN(dVar2))) {
      dVar3 = GetArcExtent(dArcStartAzimuth,local_38.azimuth,nArcDirection,1e-09);
      if (nArcDirection < 1) {
        if (dVar3 < dVar2) {
          return bVar1;
        }
      }
      else if (dVar2 < dVar3) {
        return bVar1;
      }
    }
    *bOnArc = 1;
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool PtIsOnArc(const LLPoint &llArcCenter, double dArcRadius,
                   double dArcStartAzimuth, double dArcEndAzimuth, int nArcDirection,
                   const LLPoint &llTestPt, int &bOnArc)
    {
        InverseResult invResult;
        if (!DistVincenty(llArcCenter, llTestPt, invResult))
            return false;

        bOnArc = false;

        if (fabs(invResult.distance - dArcRadius) <= 0.5e-3)
        {
            const double dSubtendedAng1 = GetArcExtent(dArcStartAzimuth, dArcEndAzimuth, nArcDirection, kTol);

            if (dSubtendedAng1 == M_2PI)
                bOnArc = true;
            else
            {
                const double dSubtendedAng2 = GetArcExtent(dArcStartAzimuth, invResult.azimuth,
                                                     nArcDirection, kTol);

                if (nArcDirection > 0)
                {
                    if (dSubtendedAng2 <= dSubtendedAng1)
                        bOnArc = true;
                }
                else
                {
                    if (dSubtendedAng2 >= dSubtendedAng1)
                        bOnArc = true;
                }
            }
        }
        return true;
    }